

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O3

void embree::error_handler(void *userPtr,RTCError code,char *str)

{
  char cVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (code == RTC_ERROR_NONE) {
    return;
  }
  uVar2 = rtcGetErrorString(code);
  printf("Embree: %s",uVar2);
  if (str == (char *)0x0) {
    putchar(10);
  }
  else {
    printf(" (");
    cVar1 = *str;
    if (cVar1 != '\0') {
      pcVar3 = str + 1;
      do {
        putchar((int)cVar1);
        cVar1 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar1 != '\0');
    }
    puts(")");
  }
  exit(1);
}

Assistant:

void error_handler(void* userPtr, const RTCError code, const char* str)
  {
    if (code == RTC_ERROR_NONE)
      return;

    printf("Embree: %s", rtcGetErrorString(code));
    if (str) {
      printf(" (");
      while (*str) putchar(*str++);
      printf(")\n");
    } else {
      printf("\n");
    }
    exit(1);
  }